

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

int stscanf(tchar_t *In,tchar_t *Mask,...)

{
  byte *pbVar1;
  byte bVar2;
  double dVar3;
  double dVar4;
  char in_AL;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  undefined8 in_RCX;
  undefined8 *puVar10;
  int *piVar11;
  uint uVar12;
  uint uVar13;
  undefined8 in_RDX;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  byte bVar18;
  long lVar19;
  undefined8 in_R8;
  long lVar20;
  undefined8 in_R9;
  int iVar21;
  int iVar22;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list Arg;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar7 = strlen(In);
  Arg[0].overflow_arg_area = &stack0x00000008;
  uVar13 = 0x10;
  iVar22 = 0;
  lVar19 = 0;
LAB_00108c0b:
  if ((sVar7 == 0) || ((byte *)In == (byte *)0x0)) {
    return iVar22;
  }
  bVar18 = *Mask;
  if ((bVar18 == 9) || (bVar18 == 0x20)) {
    pbVar1 = (byte *)In + sVar7;
    while (sVar7 != 0) {
      if ((0x20 < (ulong)(byte)*In) || ((0x100002600U >> ((ulong)(byte)*In & 0x3f) & 1) == 0))
      goto switchD_00108cad_caseD_65;
      In = (tchar_t *)((byte *)In + 1);
      sVar7 = sVar7 - 1;
    }
    sVar7 = 0;
    In = (tchar_t *)pbVar1;
  }
  else {
    if (bVar18 == 0x25) {
      uVar5 = (uint)(char)((byte *)Mask)[1];
      Mask = (tchar_t *)((byte *)Mask + 1);
      if (uVar5 - 0x3a < 0xfffffff6) {
        iVar9 = -1;
      }
      else {
        iVar9 = 0;
        while (uVar12 = (int)(char)uVar5 - 0x30, uVar12 < 10) {
          iVar9 = iVar9 * 10 + uVar12;
          pbVar1 = (byte *)Mask + 1;
          Mask = (tchar_t *)((byte *)Mask + 1);
          uVar5 = (uint)*pbVar1;
        }
      }
      do {
        uVar5 = uVar5 & 0xff;
        switch(uVar5) {
        case 100:
        case 0x69:
          goto switchD_00108cad_caseD_64;
        case 0x65:
        case 0x67:
        case 0x68:
        case 0x6a:
        case 0x6b:
        case 0x6d:
        case 0x6e:
          goto switchD_00108cad_caseD_65;
        case 0x66:
          pbVar1 = (byte *)In + sVar7;
          lVar14 = -sVar7;
          sVar17 = sVar7;
          goto LAB_00108ed0;
        case 0x6c:
          lVar19 = lVar19 + 1;
          uVar5 = (uint)((byte *)Mask)[1];
          Mask = (tchar_t *)((byte *)Mask + 1);
          break;
        case 0x6f:
          pbVar1 = (byte *)In + sVar7;
          lVar14 = -sVar7;
          goto LAB_00108efe;
        default:
          if ((uVar5 != 0x58) && (uVar5 != 0x78)) goto switchD_00108cad_caseD_65;
          pbVar1 = (byte *)In + sVar7;
          lVar14 = -sVar7;
          goto LAB_00108cfe;
        }
      } while( true );
    }
    if (bVar18 == 0) {
      return iVar22;
    }
    if (bVar18 == *In) {
      sVar7 = sVar7 - 1;
      In = (tchar_t *)((byte *)In + 1);
    }
    else {
      In = (tchar_t *)(byte *)0x0;
    }
  }
  goto switchD_00108cad_caseD_65;
LAB_00108cfe:
  if (lVar14 == 0) goto LAB_00108df7;
  bVar18 = *In;
  if ((0x20 < (ulong)bVar18) || ((0x100002600U >> ((ulong)bVar18 & 0x3f) & 1) == 0))
  goto LAB_00108dfd;
  In = (tchar_t *)((byte *)In + 1);
  lVar14 = lVar14 + 1;
  sVar7 = sVar7 - 1;
  goto LAB_00108cfe;
LAB_00108df7:
  bVar18 = *pbVar1;
  In = (tchar_t *)pbVar1;
LAB_00108dfd:
  uVar15 = (ulong)(bVar18 == 0x2d);
  lVar14 = 0;
  iVar21 = 0;
  while ((((sVar7 - uVar15 != lVar14 && (((uint)(bVar18 == 0x2d) - iVar9) + (int)lVar14 != 0)) &&
          (((byte *)In)[lVar14 + uVar15] != 0)) &&
         (iVar6 = Hex((int)(char)((byte *)In)[lVar14 + uVar15]), -1 < iVar6))) {
    iVar21 = iVar21 * 0x10 + iVar6;
    lVar14 = lVar14 + 1;
  }
  sVar7 = (sVar7 - uVar15) - lVar14;
  if (uVar15 + lVar14 != 0) {
    iVar9 = -iVar21;
    if (uVar15 == 0) {
      iVar9 = iVar21;
    }
    uVar16 = (ulong)uVar13;
    if (uVar16 < 0x29) {
      uVar13 = uVar13 + 8;
      puVar10 = (undefined8 *)((long)local_e8 + uVar16);
    }
    else {
      puVar10 = (undefined8 *)Arg[0].overflow_arg_area;
      Arg[0].overflow_arg_area = (void *)((long)Arg[0].overflow_arg_area + 8);
    }
    In = (tchar_t *)((byte *)In + lVar14 + uVar15);
    piVar11 = (int *)*puVar10;
    goto LAB_00109142;
  }
LAB_00109179:
  In = (tchar_t *)(byte *)0x0;
  goto switchD_00108cad_caseD_65;
LAB_00108efe:
  if (lVar14 == 0) goto LAB_00108f7b;
  bVar18 = *In;
  if ((0x20 < (ulong)bVar18) || ((0x100002600U >> ((ulong)bVar18 & 0x3f) & 1) == 0))
  goto LAB_00108f84;
  In = (tchar_t *)((byte *)In + 1);
  lVar14 = lVar14 + 1;
  sVar7 = sVar7 - 1;
  goto LAB_00108efe;
LAB_00108f7b:
  bVar18 = *pbVar1;
  In = (tchar_t *)pbVar1;
LAB_00108f84:
  uVar15 = (ulong)(bVar18 == 0x2d);
  lVar14 = 0;
  iVar21 = 0;
  while (((sVar7 - uVar15 != lVar14 && (iVar9 != (int)lVar14)) &&
         ((((byte *)In)[lVar14 + uVar15] & 0xf8) == 0x30))) {
    iVar21 = (uint)(byte)(((byte *)In)[lVar14 + uVar15] - 0x30) + iVar21 * 8;
    lVar14 = lVar14 + 1;
  }
  sVar7 = (sVar7 - uVar15) - lVar14;
  if (uVar15 + lVar14 == 0) goto LAB_00109003;
  iVar9 = -iVar21;
  if (uVar15 == 0) {
    iVar9 = iVar21;
  }
  uVar16 = (ulong)uVar13;
  if (uVar16 < 0x29) {
    uVar13 = uVar13 + 8;
    puVar10 = (undefined8 *)((long)local_e8 + uVar16);
  }
  else {
    puVar10 = (undefined8 *)Arg[0].overflow_arg_area;
    Arg[0].overflow_arg_area = (void *)((long)Arg[0].overflow_arg_area + 8);
  }
  In = (tchar_t *)((byte *)In + lVar14 + uVar15);
  piVar11 = (int *)*puVar10;
LAB_00109142:
  *piVar11 = iVar9;
  goto LAB_0010922c;
LAB_00108ed0:
  sVar17 = sVar17 - 1;
  if (lVar14 == 0) goto LAB_00108f27;
  bVar18 = *In;
  if ((0x20 < (ulong)bVar18) || ((0x100002600U >> ((ulong)bVar18 & 0x3f) & 1) == 0))
  goto LAB_00108f2d;
  In = (tchar_t *)((byte *)In + 1);
  lVar14 = lVar14 + 1;
  sVar7 = sVar7 - 1;
  goto LAB_00108ed0;
LAB_00108f27:
  bVar18 = *pbVar1;
  In = (tchar_t *)pbVar1;
LAB_00108f2d:
  uVar15 = (ulong)(bVar18 == 0x2d);
  lVar14 = 0;
  lVar20 = 0;
LAB_00108f4d:
  if (sVar7 - uVar15 != lVar14) {
    bVar2 = ((byte *)In)[lVar14 + uVar15];
    if (0xfffffff5 < (int)(char)bVar2 - 0x3aU) goto code_r0x00108f6b;
    lVar8 = -lVar20;
    if (bVar18 != 0x2d) {
      lVar8 = lVar20;
    }
    sVar7 = (sVar7 + -uVar15) - lVar14;
    if (uVar15 + lVar14 == 0) goto LAB_00109179;
    if (bVar2 == 0x2e) {
      lVar20 = 0;
      dVar4 = 1.0;
      while ((sVar7 = (-uVar15 + sVar17) - lVar14, sVar7 != 0 &&
             (0xfffffff5 < (int)(char)((byte *)In)[lVar14 + uVar15 + 1] - 0x3aU))) {
        lVar20 = lVar20 * 10 + (long)(int)(char)((byte *)In)[lVar14 + uVar15 + 1] + -0x30;
        dVar4 = dVar4 / 10.0;
        lVar14 = lVar14 + 1;
      }
      dVar3 = (double)lVar20;
      lVar14 = lVar14 + uVar15 + 1;
      goto LAB_001091aa;
    }
    goto LAB_0010918a;
  }
  lVar8 = -lVar20;
  if (bVar18 != 0x2d) {
    lVar8 = lVar20;
  }
  if (uVar15 + lVar14 == 0) {
    sVar7 = 0;
    goto LAB_00109179;
  }
  sVar7 = 0;
LAB_0010918a:
  dVar3 = 0.0;
  lVar14 = lVar14 + uVar15;
  dVar4 = 1.0;
LAB_001091aa:
  In = (tchar_t *)((byte *)In + lVar14);
  if (lVar19 == 0) {
    uVar15 = (ulong)uVar13;
    if (uVar15 < 0x29) {
      uVar13 = uVar13 + 8;
      puVar10 = (undefined8 *)((long)local_e8 + uVar15);
    }
    else {
      puVar10 = (undefined8 *)Arg[0].overflow_arg_area;
      Arg[0].overflow_arg_area = (void *)((long)Arg[0].overflow_arg_area + 8);
    }
    *(float *)*puVar10 = (float)(dVar3 * dVar4) + (float)lVar8;
  }
  else {
    uVar15 = (ulong)uVar13;
    if (uVar15 < 0x29) {
      uVar13 = uVar13 + 8;
      puVar10 = (undefined8 *)((long)local_e8 + uVar15);
    }
    else {
      puVar10 = (undefined8 *)Arg[0].overflow_arg_area;
      Arg[0].overflow_arg_area = (void *)((long)Arg[0].overflow_arg_area + 8);
    }
    *(double *)*puVar10 = dVar3 * dVar4 + (double)lVar8;
  }
  goto LAB_0010922c;
code_r0x00108f6b:
  lVar20 = lVar20 * 10 + (long)(int)(char)bVar2 + -0x30;
  lVar14 = lVar14 + 1;
  goto LAB_00108f4d;
switchD_00108cad_caseD_64:
  pbVar1 = (byte *)In + sVar7;
  for (lVar14 = -sVar7; lVar14 != 0; lVar14 = lVar14 + 1) {
    bVar18 = *In;
    if ((0x20 < (ulong)bVar18) || ((0x100002600U >> ((ulong)bVar18 & 0x3f) & 1) == 0))
    goto LAB_00108d67;
    In = (tchar_t *)((byte *)In + 1);
    sVar7 = sVar7 - 1;
  }
  bVar18 = *pbVar1;
  In = (tchar_t *)pbVar1;
LAB_00108d67:
  uVar15 = (ulong)(bVar18 == 0x2d);
  lVar14 = 0;
  lVar20 = 0;
  while (((sVar7 - uVar15 != lVar14 && (iVar9 != (int)lVar14)) &&
         (0xfffffff5 < (int)(char)((byte *)In)[lVar14 + uVar15] - 0x3aU))) {
    lVar20 = lVar20 * 10 + (long)(int)(char)((byte *)In)[lVar14 + uVar15] + -0x30;
    lVar14 = lVar14 + 1;
  }
  lVar8 = -lVar20;
  if (uVar15 == 0) {
    lVar8 = lVar20;
  }
  sVar7 = (sVar7 - uVar15) - lVar14;
  if (uVar15 + lVar14 == 0) {
LAB_00109003:
    In = (tchar_t *)0x0;
    goto switchD_00108cad_caseD_65;
  }
  if (lVar19 == 0) {
    uVar16 = (ulong)uVar13;
    if (uVar16 < 0x29) {
      uVar13 = uVar13 + 8;
      puVar10 = (undefined8 *)((long)local_e8 + uVar16);
    }
    else {
      puVar10 = (undefined8 *)Arg[0].overflow_arg_area;
      Arg[0].overflow_arg_area = (void *)((long)Arg[0].overflow_arg_area + 8);
    }
    *(int *)*puVar10 = (int)lVar8;
  }
  else {
    uVar16 = (ulong)uVar13;
    if (uVar16 < 0x29) {
      uVar13 = uVar13 + 8;
      puVar10 = (undefined8 *)((long)local_e8 + uVar16);
    }
    else {
      puVar10 = (undefined8 *)Arg[0].overflow_arg_area;
      Arg[0].overflow_arg_area = (void *)((long)Arg[0].overflow_arg_area + 8);
    }
    *(long *)*puVar10 = lVar8;
  }
  In = (tchar_t *)((byte *)In + lVar14 + uVar15);
LAB_0010922c:
  iVar22 = iVar22 + 1;
switchD_00108cad_caseD_65:
  Mask = (tchar_t *)((byte *)Mask + 1);
  goto LAB_00108c0b;
}

Assistant:

int stscanf(const tchar_t* In, const tchar_t* Mask, ...)
{
    int n;
    size_t InLen = tcslen(In);
	va_list Arg;
	va_start(Arg, Mask);
    n = var_stscanf_s(In,&InLen,Mask,Arg);
	va_end(Arg);
    return n;
}